

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickcdef.c
# Opt level: O3

void av1_pick_cdef_from_qp(AV1_COMMON *cm,int skip_cdef,int is_screen_content)

{
  ushort *puVar1;
  aom_bit_depth_t bit_depth;
  undefined1 auVar2 [16];
  int16_t iVar3;
  int iVar4;
  int iVar5;
  MB_MODE_INFO **ppMVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  double dVar14;
  int iVar16;
  undefined1 auVar15 [16];
  float fVar17;
  uint uVar19;
  undefined1 auVar18 [16];
  uint local_68;
  uint uStack_64;
  
  bit_depth = cm->seq_params->bit_depth;
  iVar3 = av1_ac_quant_QTX((cm->quant_params).base_qindex,0,bit_depth);
  iVar4 = (int)iVar3 >> ((char)bit_depth - 8U & 0x1f);
  (cm->cdef_info).cdef_bits = (uint)(skip_cdef != 0);
  (cm->cdef_info).nb_cdef_strengths = (skip_cdef != 0) + 1;
  (cm->cdef_info).cdef_damping = ((cm->quant_params).base_qindex >> 6) + 3;
  if (is_screen_content == 0) {
    fVar11 = (float)iVar4;
    fVar17 = (float)(iVar4 * iVar4);
    if (((cm->current_frame).frame_type & 0xfd) == 0) {
      fVar12 = roundf(fVar17 * 2.9167343e-06 + fVar11 * 0.0027798624 + 0.0079405);
      fVar13 = roundf(fVar17 * 3.3731974e-06 + fVar11 * 0.008070594 + 0.0187634);
      uVar8 = -(uint)((int)fVar12 < 3);
      uVar19 = -(uint)((int)fVar13 < 0xf);
      local_68 = ~uVar8 & 3 | (int)fVar12 & uVar8;
      uStack_64 = ~uVar19 & 0xf | (int)fVar13 & uVar19;
      local_68 = -(uint)(0 < (int)local_68) & local_68;
      uStack_64 = -(uint)(0 < (int)uStack_64) & uStack_64;
      fVar12 = roundf(fVar17 * -1.30790995e-05 + fVar11 * 0.012892405 + -0.00748388);
      iVar4 = 0xf;
      if ((int)fVar12 < 0xf) {
        iVar4 = (int)fVar12;
      }
      iVar5 = 0;
      if (0 < iVar4) {
        iVar5 = iVar4;
      }
      fVar11 = fVar17 * 3.2651783e-06 + fVar11 * 0.00035520183 + 0.00228092;
    }
    else {
      fVar12 = roundf(fVar17 * -5.7629734e-07 + fVar11 * 0.0013993345 + 0.03831067);
      fVar13 = roundf(fVar17 * -2.3593946e-06 + fVar11 * 0.0068615186 + 0.02709886);
      uVar8 = -(uint)((int)fVar12 < 3);
      uVar19 = -(uint)((int)fVar13 < 0xf);
      local_68 = ~uVar8 & 3 | (int)fVar12 & uVar8;
      uStack_64 = ~uVar19 & 0xf | (int)fVar13 & uVar19;
      local_68 = -(uint)(0 < (int)local_68) & local_68;
      uStack_64 = -(uint)(0 < (int)uStack_64) & uStack_64;
      fVar12 = roundf(fVar17 * -7.095069e-07 + fVar11 * 0.0034628846 + 0.00887099);
      iVar4 = 0xf;
      if ((int)fVar12 < 0xf) {
        iVar4 = (int)fVar12;
      }
      iVar5 = 0;
      if (0 < iVar4) {
        iVar5 = iVar4;
      }
      fVar11 = fVar17 * 2.3874085e-07 + fVar11 * 0.00028223585 + 0.05576307;
    }
    fVar11 = roundf(fVar11);
    uVar7 = CONCAT44(uStack_64,local_68);
    iVar4 = (int)fVar11;
  }
  else {
    dVar14 = (double)iVar4;
    iVar5 = (int)(dVar14 * -6.79500136e-06 * dVar14 + dVar14 * 0.0102695586 + 0.136126802);
    iVar4 = (int)(dVar14 * -9.99613695e-08 * dVar14 + dVar14 * -1.79361339e-05 + 1.17022324);
    iVar10 = (int)(dVar14 * 0.0065895783 + dVar14 * -7.79934857e-06 * dVar14 + 0.881045025);
    iVar16 = (int)(dVar14 * 0.00610391455 + dVar14 * 5.88217781e-06 * dVar14 + 0.0995043102);
    auVar2 = ZEXT816(0xf00000003);
    auVar18._0_8_ = CONCAT44(-(uint)(iVar16 < auVar2._4_4_),-(uint)(iVar10 < auVar2._0_4_));
    auVar18._8_8_ = 0;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = CONCAT44(iVar16,iVar10) & auVar18._0_8_;
    auVar15 = ~auVar18 & auVar2 | auVar15;
    iVar10 = 0xf;
    if (iVar5 < 0xf) {
      iVar10 = iVar5;
    }
    uVar7 = CONCAT44(-(uint)(0 < auVar15._4_4_),-(uint)(0 < auVar15._0_4_)) & auVar15._0_8_;
    iVar5 = 0;
    if (0 < iVar10) {
      iVar5 = iVar10;
    }
  }
  iVar10 = 3;
  if (iVar4 < 3) {
    iVar10 = iVar4;
  }
  if (iVar10 < 1) {
    iVar10 = 0;
  }
  (cm->cdef_info).cdef_strengths[0] = (int)uVar7 + (int)(uVar7 >> 0x20) * 4;
  (cm->cdef_info).cdef_uv_strengths[0] = iVar10 + iVar5 * 4;
  if (skip_cdef == 0) {
    iVar4 = (cm->mi_params).mi_rows;
    ppMVar6 = (cm->mi_params).mi_grid_base;
    if (0 < iVar4 && ppMVar6 != (MB_MODE_INFO **)0x0) {
      iVar5 = (cm->mi_params).mi_cols;
      iVar10 = iVar5 + 0x1e;
      if (-1 < iVar5 + 0xf) {
        iVar10 = iVar5 + 0xf;
      }
      uVar7 = 1;
      if (1 < iVar10 >> 4) {
        uVar7 = (ulong)(uint)(iVar10 >> 4);
      }
      uVar8 = 0;
      do {
        if (0 < iVar5) {
          lVar9 = 0;
          do {
            puVar1 = (ushort *)(*(long *)((long)ppMVar6 + lVar9) + 0xa7);
            *puVar1 = *puVar1 & 0x87ff;
            lVar9 = lVar9 + 0x80;
          } while (uVar7 * 0x80 != lVar9);
        }
        ppMVar6 = ppMVar6 + (long)(cm->mi_params).mi_stride * 0x10;
        uVar8 = uVar8 + 1;
      } while (uVar8 != iVar4 + 0xfU >> 4);
    }
  }
  else {
    (cm->cdef_info).cdef_strengths[1] = 0;
    (cm->cdef_info).cdef_uv_strengths[1] = 0;
  }
  return;
}

Assistant:

void av1_pick_cdef_from_qp(AV1_COMMON *const cm, int skip_cdef,
                           int is_screen_content) {
  const int bd = cm->seq_params->bit_depth;
  const int q =
      av1_ac_quant_QTX(cm->quant_params.base_qindex, 0, bd) >> (bd - 8);
  CdefInfo *const cdef_info = &cm->cdef_info;
  // Check the speed feature to avoid extra signaling.
  if (skip_cdef) {
    cdef_info->cdef_bits = 1;
    cdef_info->nb_cdef_strengths = 2;
  } else {
    cdef_info->cdef_bits = 0;
    cdef_info->nb_cdef_strengths = 1;
  }
  cdef_info->cdef_damping = 3 + (cm->quant_params.base_qindex >> 6);

  int predicted_y_f1 = 0;
  int predicted_y_f2 = 0;
  int predicted_uv_f1 = 0;
  int predicted_uv_f2 = 0;
  if (is_screen_content) {
    predicted_y_f1 =
        (int)(5.88217781e-06 * q * q + 6.10391455e-03 * q + 9.95043102e-02);
    predicted_y_f2 =
        (int)(-7.79934857e-06 * q * q + 6.58957830e-03 * q + 8.81045025e-01);
    predicted_uv_f1 =
        (int)(-6.79500136e-06 * q * q + 1.02695586e-02 * q + 1.36126802e-01);
    predicted_uv_f2 =
        (int)(-9.99613695e-08 * q * q - 1.79361339e-05 * q + 1.17022324e+0);
    predicted_y_f1 = clamp(predicted_y_f1, 0, 15);
    predicted_y_f2 = clamp(predicted_y_f2, 0, 3);
    predicted_uv_f1 = clamp(predicted_uv_f1, 0, 15);
    predicted_uv_f2 = clamp(predicted_uv_f2, 0, 3);
  } else {
    if (!frame_is_intra_only(cm)) {
      predicted_y_f1 = clamp((int)roundf(q * q * -0.0000023593946f +
                                         q * 0.0068615186f + 0.02709886f),
                             0, 15);
      predicted_y_f2 = clamp((int)roundf(q * q * -0.00000057629734f +
                                         q * 0.0013993345f + 0.03831067f),
                             0, 3);
      predicted_uv_f1 = clamp((int)roundf(q * q * -0.0000007095069f +
                                          q * 0.0034628846f + 0.00887099f),
                              0, 15);
      predicted_uv_f2 = clamp((int)roundf(q * q * 0.00000023874085f +
                                          q * 0.00028223585f + 0.05576307f),
                              0, 3);
    } else {
      predicted_y_f1 = clamp(
          (int)roundf(q * q * 0.0000033731974f + q * 0.008070594f + 0.0187634f),
          0, 15);
      predicted_y_f2 = clamp((int)roundf(q * q * 0.0000029167343f +
                                         q * 0.0027798624f + 0.0079405f),
                             0, 3);
      predicted_uv_f1 = clamp((int)roundf(q * q * -0.0000130790995f +
                                          q * 0.012892405f - 0.00748388f),
                              0, 15);
      predicted_uv_f2 = clamp((int)roundf(q * q * 0.0000032651783f +
                                          q * 0.00035520183f + 0.00228092f),
                              0, 3);
    }
  }
  cdef_info->cdef_strengths[0] =
      predicted_y_f1 * CDEF_SEC_STRENGTHS + predicted_y_f2;
  cdef_info->cdef_uv_strengths[0] =
      predicted_uv_f1 * CDEF_SEC_STRENGTHS + predicted_uv_f2;

  // mbmi->cdef_strength is already set in the encoding stage. We don't need to
  // set it again here.
  if (skip_cdef) {
    cdef_info->cdef_strengths[1] = 0;
    cdef_info->cdef_uv_strengths[1] = 0;
    return;
  }

  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const int nvfb = (mi_params->mi_rows + MI_SIZE_64X64 - 1) / MI_SIZE_64X64;
  const int nhfb = (mi_params->mi_cols + MI_SIZE_64X64 - 1) / MI_SIZE_64X64;
  MB_MODE_INFO **mbmi = mi_params->mi_grid_base;
  // mbmi is NULL when real-time rate control library is used.
  if (!mbmi) return;
  for (int r = 0; r < nvfb; ++r) {
    for (int c = 0; c < nhfb; ++c) {
      MB_MODE_INFO *current_mbmi = mbmi[MI_SIZE_64X64 * c];
      current_mbmi->cdef_strength = 0;
    }
    mbmi += MI_SIZE_64X64 * mi_params->mi_stride;
  }
}